

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTime.c
# Opt level: O1

float Tim_ManGetCiArrival(Tim_Man_t *p,int iCi)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Tim_Obj_t *pTVar5;
  Tim_Obj_t *pTVar6;
  float *pfVar7;
  int *piVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  float fVar12;
  
  if (p->nCis <= iCi) {
    __assert_fail("i < p->nCis",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timInt.h"
                  ,0x5d,"Tim_Obj_t *Tim_ManCi(Tim_Man_t *, int)");
  }
  pTVar5 = p->pCis;
  iVar2 = p->fUseTravId;
  if ((iVar2 == 0) || (pTVar5[iCi].TravId != p->nTravIds)) {
    iVar3 = p->nTravIds;
    pTVar5[iCi].TravId = iVar3;
    iVar9 = pTVar5[iCi].iObj2Box;
    if ((long)iVar9 < 0) {
      piVar8 = (int *)0x0;
    }
    else {
      if (p->vBoxes->nSize <= iVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      piVar8 = (int *)p->vBoxes->pArray[iVar9];
    }
    if (piVar8 != (int *)0x0) {
      piVar8[1] = iVar3;
      if ((iVar2 != 0) && (0 < piVar8[2])) {
        lVar10 = 0;
        do {
          if (p->pCos == (Tim_Obj_t *)0x0) break;
          if (p->pCos[piVar8[lVar10 + 7]].TravId != p->nTravIds) {
            puts("Tim_ManGetCiArrival(): Input arrival times of the box are not up to date!");
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < piVar8[2]);
      }
      pfVar7 = Tim_ManBoxDelayTable(p,*piVar8);
      iVar2 = piVar8[3];
      if ((0 < (long)iVar2) && (pTVar6 = p->pCis, pTVar6 != (Tim_Obj_t *)0x0)) {
        uVar4 = piVar8[2];
        pfVar7 = pfVar7 + 3;
        iVar3 = p->nTravIds;
        lVar10 = 0;
        do {
          fVar12 = -1e+09;
          if (0 < (int)uVar4) {
            uVar11 = 0;
            fVar12 = -1e+09;
            do {
              if (p->pCos == (Tim_Obj_t *)0x0) {
                fVar12 = -1e+09;
                break;
              }
              fVar1 = pfVar7[uVar11];
              if ((fVar1 != -1e+09) || (NAN(fVar1))) {
                iVar9 = (int)(fVar1 + p->pCos[piVar8[uVar11 + 7]].timeArr);
                if (iVar9 < (int)fVar12) {
                  iVar9 = (int)fVar12;
                }
                fVar12 = (float)iVar9;
              }
              uVar11 = uVar11 + 1;
            } while (uVar4 != uVar11);
          }
          iVar9 = piVar8[lVar10 + (int)uVar4 + 7];
          pTVar6[iVar9].timeArr = fVar12;
          pTVar6[iVar9].TravId = iVar3;
          lVar10 = lVar10 + 1;
          pfVar7 = pfVar7 + (int)uVar4;
        } while (lVar10 != iVar2);
      }
    }
  }
  return pTVar5[iCi].timeArr;
}

Assistant:

float Tim_ManGetCiArrival( Tim_Man_t * p, int iCi )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObjThis, * pObj, * pObjRes;
    float * pTable, * pDelays, DelayBest;
    int i, k;
    // consider the already processed PI
    pObjThis = Tim_ManCi( p, iCi );
    if ( p->fUseTravId && pObjThis->TravId == p->nTravIds )
        return pObjThis->timeArr;
    pObjThis->TravId = p->nTravIds;
    // consider the main PI
    pBox = Tim_ManCiBox( p, iCi );
    if ( pBox == NULL )
        return pObjThis->timeArr;
    // update box timing
    pBox->TravId = p->nTravIds;
    // get the arrival times of the inputs of the box (POs)
    if ( p->fUseTravId )
    Tim_ManBoxForEachInput( p, pBox, pObj, i )
        if ( pObj->TravId != p->nTravIds )
            printf( "Tim_ManGetCiArrival(): Input arrival times of the box are not up to date!\n" );
    // compute the arrival times for each output of the box (PIs)
    pTable = Tim_ManBoxDelayTable( p, pBox->iBox );
    Tim_ManBoxForEachOutput( p, pBox, pObjRes, i )
    {
        pDelays = pTable + 3 + i * pBox->nInputs;
        DelayBest = -TIM_ETERNITY;
        Tim_ManBoxForEachInput( p, pBox, pObj, k )
			if ( pDelays[k] != -ABC_INFINITY )
				DelayBest = Abc_MaxInt( DelayBest, pObj->timeArr + pDelays[k] );
        pObjRes->timeArr = DelayBest;
        pObjRes->TravId = p->nTravIds;
    }
    return pObjThis->timeArr;
}